

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_ByteString_allocBuffer(UA_ByteString *bs,size_t length)

{
  UA_Byte *pUVar1;
  UA_StatusCode UVar2;
  
  bs->length = 0;
  bs->data = (UA_Byte *)0x0;
  UVar2 = 0;
  if (length != 0) {
    pUVar1 = (UA_Byte *)malloc(length);
    bs->data = pUVar1;
    if (pUVar1 == (UA_Byte *)0x0) {
      UVar2 = 0x80030000;
    }
    else {
      bs->length = length;
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_ByteString_allocBuffer(UA_ByteString *bs, size_t length) {
    UA_ByteString_init(bs);
    if(length == 0)
        return UA_STATUSCODE_GOOD;
    if(!(bs->data = (UA_Byte*)UA_malloc(length)))
        return UA_STATUSCODE_BADOUTOFMEMORY;
    bs->length = length;
    return UA_STATUSCODE_GOOD;
}